

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::draw
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QTransform *transformPtr,QRegion *exposedRegion,QWidget *widget,
          qreal opacity,QTransform *effectTransform,bool wasDirtyParentSceneTransform,bool drawItem)

{
  undefined1 *puVar1;
  QStyleOptionGraphicsItem *option;
  QGraphicsItemPrivate *pQVar2;
  long lVar3;
  ulong uVar4;
  QGraphicsItem *pQVar5;
  bool bVar6;
  int iVar7;
  QPen *pQVar8;
  QBrush *pQVar9;
  byte bVar10;
  QGraphicsItemPrivate *pQVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QRectF boundingRect;
  QBrush oldBrush;
  QPen oldPen;
  char local_b8;
  QRectF local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (item->d_ptr).d;
  lVar3 = (pQVar2->children).d.size;
  uVar4 = *(ulong *)&pQVar2->field_0x160;
  bVar10 = (byte)(uint)(uVar4 >> 0x24) & 1;
  if (lVar3 == 0) {
    uVar12 = 0;
    bVar6 = false;
  }
  else {
    pQVar11 = pQVar2;
    if ((uVar4 >> 0x24 & 1) != 0) {
      setWorldTransform(painter,transformPtr,effectTransform);
      pQVar11 = (item->d_ptr).d;
    }
    QGraphicsItemPrivate::ensureSortedChildren(pQVar11);
    if ((*(ulong *)&(((*(pQVar2->children).d.ptr)->d_ptr).d)->field_0x160 & 0x10000000000) == 0) {
      bVar6 = false;
      uVar12 = 0;
    }
    else {
      if ((uVar4 >> 0x24 & 1) != 0) {
        setClip(painter,item);
      }
      for (uVar12 = 0; uVar12 < (ulong)(pQVar2->children).d.size; uVar12 = uVar12 + 1) {
        pQVar5 = (pQVar2->children).d.ptr[uVar12];
        if (wasDirtyParentSceneTransform) {
          puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
        }
        uVar13 = *(ulong *)&((pQVar5->d_ptr).d)->field_0x160;
        if ((uVar13 & 0x10000000000) == 0) break;
        if ((0.001 <= opacity) || ((uVar13 & 0x4000000000) != 0)) {
          drawSubtreeRecursive
                    (this,pQVar5,painter,viewTransform,exposedRegion,widget,opacity,effectTransform)
          ;
        }
      }
      uVar12 = uVar12 & 0xffffffff;
      bVar6 = true;
      bVar10 = 0;
    }
  }
  if (!drawItem) goto LAB_0059e7c8;
  pQVar11 = (item->d_ptr).d;
  option = &this->styleOptionTmp;
  if (exposedRegion == (QRegion *)0x0) {
    QRegion::QRegion((QRegion *)&local_78);
  }
  else {
    QRegion::QRegion((QRegion *)&local_78,exposedRegion);
  }
  QGraphicsItemPrivate::initStyleOption
            (pQVar11,option,transformPtr,(QRegion *)&local_78,exposedRegion == (QRegion *)0x0);
  QRegion::~QRegion((QRegion *)&local_78);
  uVar13 = *(ulong *)&((item->d_ptr).d)->field_0x160 & 0x800000000;
  if ((uVar4 >> 0x24 & 1) == 0 || lVar3 == 0) {
    local_b8 = (char)(uVar13 >> 0x23);
    setWorldTransform(painter,transformPtr,effectTransform);
    if (uVar13 != 0) {
      setClip(painter,item);
    }
  }
  else {
    if (bVar6) {
      if (uVar13 == 0) {
        QPainter::restore();
        bVar10 = 1;
      }
      else {
        setWorldTransform(painter,transformPtr,effectTransform);
      }
    }
    else if (uVar13 != 0) {
      setClip(painter,item);
      local_b8 = '\0';
      bVar10 = 0;
      goto LAB_0059e5ea;
    }
    local_b8 = '\0';
  }
LAB_0059e5ea:
  if (((this->field_0xb9 & 0x40) != 0) && (local_b8 == '\0')) {
    QPainter::save();
  }
  QPainter::setOpacity(opacity);
  if ((*(ushort *)&((item->d_ptr).d)->field_0x162 & 0x160) == 0) {
    (*item->_vptr_QGraphicsItem[10])(item,painter,option,widget);
  }
  else {
    drawItemHelper(this,item,painter,option,widget,
                   (bool)((byte)(*(uint *)&this->field_0xb8 >> 0xe) & 1));
  }
  if (((this->field_0xb9 & 0x40) != 0) || (local_b8 != '\0')) {
    QPainter::restore();
  }
  if ((draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
       ::drawRect == '\0') &&
     (iVar7 = __cxa_guard_acquire(&draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
                                   ::drawRect), iVar7 != 0)) {
    draw::drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS",(bool *)0x0);
    __cxa_guard_release(&draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
                         ::drawRect);
  }
  if (draw::drawRect != 0) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_50,pQVar8);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = (QBrush *)QPainter::brush();
    QBrush::QBrush((QBrush *)&local_58,pQVar9);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = item;
    local_3c = 0xaaaaaaaa;
    auVar14 = QColor::fromHsv(SUB164(auVar14 % ZEXT816(0xff),0),0xff,0xff,0xff);
    local_48 = auVar14._0_8_;
    local_40 = auVar14._8_4_;
    local_3c = CONCAT22(local_3c._2_2_,auVar14._12_2_);
    QPainter::setPen((QColor *)painter);
    QPainter::setBrush((BrushStyle)painter);
    local_78.w._0_4_ = 0xffffffff;
    local_78.w._4_4_ = 0xffffffff;
    local_78.h._0_4_ = 0xffffffff;
    local_78.h._4_4_ = 0xffffffff;
    local_78.xp._0_4_ = 0xffffffff;
    local_78.xp._4_4_ = 0xffffffff;
    local_78.yp._0_4_ = 0xffffffff;
    local_78.yp._4_4_ = 0xffffffff;
    (*item->_vptr_QGraphicsItem[3])(&local_78,item);
    _q_adjustRect(&local_78);
    QPainter::drawRect(painter,&local_78);
    QPainter::setPen((QPen *)painter);
    QPainter::setBrush((QBrush *)painter);
    QBrush::~QBrush((QBrush *)&local_58);
    QPen::~QPen((QPen *)&local_50);
  }
LAB_0059e7c8:
  if (lVar3 != 0) {
    if (bVar10 != 0) {
      setClip(painter,item);
    }
    for (; uVar12 < (ulong)(pQVar2->children).d.size; uVar12 = uVar12 + 1) {
      pQVar5 = (pQVar2->children).d.ptr[uVar12];
      if (wasDirtyParentSceneTransform) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      if ((0.001 <= opacity) || ((*(ulong *)&((pQVar5->d_ptr).d)->field_0x160 & 0x4000000000) != 0))
      {
        drawSubtreeRecursive
                  (this,pQVar5,painter,viewTransform,exposedRegion,widget,opacity,effectTransform);
      }
    }
    if ((uVar4 >> 0x24 & 1) != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::draw(QGraphicsItem *item, QPainter *painter, const QTransform *const viewTransform,
                                 const QTransform *const transformPtr, QRegion *exposedRegion, QWidget *widget,
                                 qreal opacity, const QTransform *effectTransform,
                                 bool wasDirtyParentSceneTransform, bool drawItem)
{
    const auto &children = item->d_ptr->children;

    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape);
    const bool itemHasChildren = !children.isEmpty();
    bool setChildClip = itemClipsChildrenToShape;
    bool itemHasChildrenStackedBehind = false;

    int i = 0;
    if (itemHasChildren) {
        if (itemClipsChildrenToShape)
            setWorldTransform(painter, transformPtr, effectTransform);

        item->d_ptr->ensureSortedChildren();
        // Items with the 'ItemStacksBehindParent' flag are put in front of the list
        // so all we have to do is to check the first item.
        itemHasChildrenStackedBehind = (children.at(0)->d_ptr->flags
                                        & QGraphicsItem::ItemStacksBehindParent);

        if (itemHasChildrenStackedBehind) {
            if (itemClipsChildrenToShape) {
                setClip(painter, item);
                setChildClip = false;
            }

            // Draw children behind
            for (i = 0; i < children.size(); ++i) {
                QGraphicsItem *child = children.at(i);
                if (wasDirtyParentSceneTransform)
                    child->d_ptr->dirtySceneTransform = 1;
                if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                    break;
                if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                    continue;
                drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
            }
        }
    }

    // Draw item
    if (drawItem) {
        Q_ASSERT(!itemIsFullyTransparent);
        Q_ASSERT(!(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents));
        Q_ASSERT(transformPtr);
        item->d_ptr->initStyleOption(&styleOptionTmp, *transformPtr, exposedRegion
                                     ? *exposedRegion : QRegion(), exposedRegion == nullptr);

        const bool itemClipsToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsToShape;
        bool restorePainterClip = false;

        if (!itemHasChildren || !itemClipsChildrenToShape) {
            // Item does not have children or clip children to shape.
            setWorldTransform(painter, transformPtr, effectTransform);
            if ((restorePainterClip = itemClipsToShape))
                setClip(painter, item);
        } else if (itemHasChildrenStackedBehind){
            // Item clips children to shape and has children stacked behind, which means
            // the painter is already clipped to the item's shape.
            if (itemClipsToShape) {
                // The clip is already correct. Ensure correct world transform.
                setWorldTransform(painter, transformPtr, effectTransform);
            } else {
                // Remove clip (this also ensures correct world transform).
                painter->restore();
                setChildClip = true;
            }
        } else if (itemClipsToShape) {
            // Item clips children and itself to shape. It does not have hildren stacked
            // behind, which means the clip has not yet been set. We set it now and re-use it
            // for the children.
            setClip(painter, item);
            setChildClip = false;
        }

        if (painterStateProtection && !restorePainterClip)
            painter->save();

        painter->setOpacity(opacity);
        if (!item->d_ptr->cacheMode && !item->d_ptr->isWidget)
            item->paint(painter, &styleOptionTmp, widget);
        else
            drawItemHelper(item, painter, &styleOptionTmp, widget, painterStateProtection);

        if (painterStateProtection || restorePainterClip)
            painter->restore();

        static int drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS");
        if (drawRect) {
            QPen oldPen = painter->pen();
            QBrush oldBrush = painter->brush();
            quintptr ptr = reinterpret_cast<quintptr>(item);
            const QColor color = QColor::fromHsv(ptr % 255, 255, 255);
            painter->setPen(color);
            painter->setBrush(Qt::NoBrush);
            painter->drawRect(adjustedItemBoundingRect(item));
            painter->setPen(oldPen);
            painter->setBrush(oldBrush);
        }
    }

    // Draw children in front
    if (itemHasChildren) {
        if (setChildClip)
            setClip(painter, item);

        for (; i < children.size(); ++i) {
            QGraphicsItem *child = children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
        }

        // Restore child clip
        if (itemClipsChildrenToShape)
            painter->restore();
    }
}